

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Query_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Minefield_Query_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Minefield_Query_PDU *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer pPVar3;
  reference puVar4;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_2d0;
  const_iterator citrEndSt;
  const_iterator citrSt;
  KString local_2a0;
  __normal_iterator<const_KDIS::DATA_TYPE::PerimeterPointCoordinate_*,_std::vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>_>
  local_280;
  const_iterator citrEndPnt;
  const_iterator citrPnt;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Minefield_Query_PDU *local_18;
  Minefield_Query_PDU *this_local;
  
  local_18 = this;
  this_local = (Minefield_Query_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"-Minefield Query PDU-\n");
  Minefield_Header::GetAsString_abi_cxx11_(&local_1f0,&this->super_Minefield_Header);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"Requesting ID:           ");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_230,&this->m_ReqID);
  UTILS::IndentString(&local_210,&local_230,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_210);
  poVar2 = std::operator<<(poVar2,"Request ID:              ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8ReqID);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Of Permim Points: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8NumPerimPoints);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Of Sensor Types:  ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8NumSensTyp);
  poVar2 = std::operator<<(poVar2,"\n");
  DATA_TYPE::MinefieldDataFilter::GetAsString_abi_cxx11_(&local_250,&this->m_DataFilter);
  poVar2 = std::operator<<(poVar2,(string *)&local_250);
  poVar2 = std::operator<<(poVar2,"Mine Type Filter:        ");
  DATA_TYPE::EntityType::GetAsString_abi_cxx11_((KString *)&citrPnt,&this->m_MineTypFilter);
  poVar2 = std::operator<<(poVar2,(string *)&citrPnt);
  std::operator<<(poVar2,"Perimeter Points:\n");
  std::__cxx11::string::~string((string *)&citrPnt);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  citrEndPnt = std::
               vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
               ::begin(&this->m_vPoints);
  local_280._M_current =
       (PerimeterPointCoordinate *)
       std::
       vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
       ::end(&this->m_vPoints);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEndPnt,&local_280);
    if (!bVar1) break;
    pPVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::PerimeterPointCoordinate_*,_std::vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>_>
             ::operator->(&citrEndPnt);
    (*(pPVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(&citrSt);
    UTILS::IndentString(&local_2a0,(KString *)&citrSt,1,'\t');
    std::operator<<(local_190,(string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&citrSt);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::PerimeterPointCoordinate_*,_std::vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>_>
    ::operator++(&citrEndPnt);
  }
  std::operator<<(local_190,"Sensor Types:\n");
  citrEndSt = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                        (&this->m_vui16SensorTypes);
  local_2d0._M_current =
       (unsigned_short *)
       std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(&this->m_vui16SensorTypes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEndSt,&local_2d0);
    if (!bVar1) break;
    poVar2 = std::operator<<(local_190,"\t");
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
             ::operator*(&citrEndSt);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*puVar4);
    std::operator<<(poVar2,"\n");
    __gnu_cxx::
    __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
    ::operator++(&citrEndSt);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Minefield_Query_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Minefield Query PDU-\n"
       << Minefield_Header::GetAsString()
       << "Requesting ID:           " << IndentString( m_ReqID.GetAsString(), 1 )
       << "Request ID:              " << ( KUINT16 )m_ui8ReqID          << "\n"
       << "Number Of Permim Points: " << ( KUINT16 )m_ui8NumPerimPoints << "\n"
       << "Number Of Sensor Types:  " << ( KUINT16 )m_ui8NumSensTyp     << "\n"
       << m_DataFilter.GetAsString()
       << "Mine Type Filter:        " << m_MineTypFilter.GetAsString()
       << "Perimeter Points:\n";

    std::vector<PerimeterPointCoordinate>::const_iterator citrPnt = m_vPoints.begin();
    std::vector<PerimeterPointCoordinate>::const_iterator citrEndPnt = m_vPoints.end();
    for( ; citrPnt != citrEndPnt; ++citrPnt )
    {
        ss << IndentString( citrPnt->GetAsString(), 1 );
    }

    ss << "Sensor Types:\n";

    std::vector<KUINT16>::const_iterator citrSt = m_vui16SensorTypes.begin();
    std::vector<KUINT16>::const_iterator citrEndSt = m_vui16SensorTypes.end();
    for( ; citrSt != citrEndSt; ++citrSt )
    {
        ss << "\t" << *citrSt << "\n";
    }

    return ss.str();
}